

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O0

int got_eagain(void)

{
  int *piVar1;
  undefined1 local_9;
  
  piVar1 = __errno_location();
  local_9 = true;
  if (*piVar1 != 0xb) {
    piVar1 = __errno_location();
    local_9 = true;
    if (*piVar1 != 0x73) {
      piVar1 = __errno_location();
      local_9 = *piVar1 == 0xb;
    }
  }
  return (int)local_9;
}

Assistant:

static int got_eagain(void) {
#ifdef _WIN32
  return WSAGetLastError() == WSAEWOULDBLOCK;
#else
  return errno == EAGAIN
      || errno == EINPROGRESS
#ifdef EWOULDBLOCK
      || errno == EWOULDBLOCK;
#endif
      ;
#endif
}